

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph::Gotlieb(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *__return_storage_ptr__,Graph *this,int r,int *m,
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              *adjMatrix)

{
  pointer piVar1;
  pointer piVar2;
  pointer pvVar3;
  long lVar4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar5;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *pvVar6;
  int iVar7;
  Graph *pGVar8;
  ostream *poVar9;
  Graph *pGVar10;
  int iVar11;
  undefined4 in_register_00000014;
  Graph *pGVar12;
  long lVar13;
  Graph *pGVar14;
  bool bVar15;
  Graph *pGVar16;
  pointer pvVar17;
  int n;
  long lVar18;
  uint uVar19;
  long lVar20;
  size_type sVar21;
  int *piVar22;
  bool bVar23;
  reference rVar24;
  allocator_type local_101;
  Graph *local_100;
  Graph *local_f8;
  allocator_type local_e9;
  size_type local_e8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_e0;
  Graph *local_d8;
  ostream *local_d0;
  Graph *local_c8;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_c0;
  int *local_b8;
  Graph *local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dmat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  copytreeAdjMat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAdjMat;
  _Vector_base<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> x;
  
  local_d0 = (ostream *)CONCAT44(in_register_00000014,r);
  *m = 0;
  sVar21 = (size_type)r;
  treeAdjMat.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_b8 = m;
  local_b0 = this;
  std::vector<int,_std::allocator<int>_>::vector
            (&x,sVar21,(value_type_conflict *)&treeAdjMat,(allocator_type *)&copytreeAdjMat);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&copytreeAdjMat,sVar21,(allocator_type *)&dmat);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&treeAdjMat,sVar21,(value_type *)&copytreeAdjMat,(allocator_type *)&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&copytreeAdjMat);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&dmat,sVar21,(allocator_type *)&local_60);
  local_e8 = sVar21;
  local_c0 = adjMatrix;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&copytreeAdjMat,sVar21,(value_type *)&dmat,&local_101);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&dmat);
  lVar20 = 0;
  local_d8 = (Graph *)0x0;
  if (0 < (int)local_d0) {
    local_d8 = (Graph *)((ulong)local_d0 & 0xffffffff);
  }
  pGVar12 = (Graph *)((ulong)local_d0 & 0xffffffff);
  pGVar8 = (Graph *)0x0;
  local_e0 = __return_storage_ptr__;
  while (pGVar10 = local_d8, sVar21 = local_e8, pGVar8 != local_d8) {
    bVar15 = false;
    local_c8 = (Graph *)((long)pGVar8 * 0x18);
    local_100 = pGVar8;
    local_f8 = (Graph *)lVar20;
    for (pGVar10 = pGVar8; pGVar12 != pGVar10; pGVar10 = (Graph *)((long)&pGVar10->r + 1)) {
      rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((local_c0->
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (long)pGVar8,
                          (size_type)pGVar10);
      if (!bVar15 && (*rVar24._M_p & rVar24._M_mask) != 0) {
        *(undefined4 *)
         (*(long *)((long)&local_c8->r +
                   CONCAT44(treeAdjMat.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            treeAdjMat.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_)) + (long)pGVar10 * 4) =
             1;
        *(undefined4 *)
         (*(long *)(CONCAT44(treeAdjMat.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             treeAdjMat.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar20) +
         (long)local_100 * 4) = 1;
        bVar15 = true;
      }
      lVar20 = lVar20 + 0x18;
    }
    lVar20 = (long)local_f8 + 0x18;
    pGVar8 = (Graph *)((long)&local_100->r + 1);
  }
  for (pGVar8 = (Graph *)0x0; pGVar8 != local_d8; pGVar8 = (Graph *)((long)&pGVar8->r + 1)) {
    for (pGVar14 = (Graph *)0x0; pGVar12 != pGVar14; pGVar14 = (Graph *)((long)&pGVar14->r + 1)) {
      copytreeAdjMat.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pGVar8].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(long)pGVar14] =
           *(int *)(*(long *)(CONCAT44(treeAdjMat.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       treeAdjMat.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                             (long)pGVar8 * 0x18) + (long)pGVar14 * 4);
    }
  }
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_d0);
  poVar9 = std::operator<<(poVar9,"\n");
  for (pGVar8 = (Graph *)0x0; pGVar8 != pGVar10; pGVar8 = (Graph *)((long)&pGVar8->r + 1)) {
    for (pGVar14 = (Graph *)0x0; pGVar14 != pGVar12; pGVar14 = (Graph *)((long)&pGVar14->r + 1)) {
      piVar1 = copytreeAdjMat.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pGVar8].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (piVar1[(long)pGVar14] == 1) {
        for (pGVar16 = (Graph *)0x0; poVar9 = local_d0, pGVar12 != pGVar16;
            pGVar16 = (Graph *)((long)&pGVar16->r + 1)) {
          piVar2 = copytreeAdjMat.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pGVar14].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if (piVar2[(long)pGVar16] == 1) {
            piVar1[(long)pGVar16] = 1;
            piVar22 = piVar2 + (long)pGVar16;
            *piVar22 = -*piVar22;
          }
        }
      }
    }
  }
  for (pGVar8 = (Graph *)0x0; pGVar8 != pGVar10; pGVar8 = (Graph *)((long)&pGVar8->r + 1)) {
    bVar15 = false;
    for (pGVar14 = (Graph *)0x0; pGVar14 != pGVar12; pGVar14 = (Graph *)((long)&pGVar14->r + 1)) {
      piVar1 = copytreeAdjMat.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pGVar14].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (piVar1[(long)pGVar8] == 1) {
        if (bVar15) {
          for (pGVar16 = (Graph *)0x0; pGVar12 != pGVar16;
              pGVar16 = (Graph *)((long)&pGVar16->r + 1)) {
            if (piVar1[(long)pGVar16] == 1) {
              copytreeAdjMat.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)poVar9].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(long)pGVar16] = 1;
              piVar1[(long)pGVar16] = -piVar1[(long)pGVar16];
            }
          }
        }
        else {
          bVar15 = true;
          poVar9 = (ostream *)((ulong)pGVar14 & 0xffffffff);
        }
      }
    }
  }
  pGVar8 = (Graph *)0x0;
  uVar19 = 0;
  do {
    if (pGVar8 == pGVar10) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,sVar21,(allocator_type *)&local_101)
      ;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&dmat,(long)(int)uVar19,(value_type *)&local_60,&local_e9);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
      pGVar8 = (Graph *)0x0;
      iVar11 = 0;
      do {
        if (pGVar8 == pGVar10) {
          pGVar8 = (Graph *)0x0;
          local_100 = (Graph *)(ulong)uVar19;
          if ((int)uVar19 < 1) {
            local_100 = pGVar8;
          }
          lVar20 = (long)local_100 * 0x18;
          for (; pGVar8 != local_d8; pGVar8 = (Graph *)((long)&pGVar8->r + 1)) {
            for (lVar13 = 0; lVar20 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
              if ((*(int *)(*(long *)((long)&((dmat.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start + lVar13) +
                           (long)pGVar8 * 4) == 0) && (pGVar8 == (Graph *)(ulong)(uVar19 - 1))) {
                puts("\nError in block 2 while searching for independent meshes");
              }
            }
          }
          local_f8 = (Graph *)((ulong)local_100 & 0xffffffff);
          bVar15 = false;
          pGVar10 = (Graph *)0x0;
          pGVar8 = local_d8;
          while (pGVar10 != local_f8) {
            local_c8 = pGVar10;
            for (pGVar14 = (Graph *)0x0; pGVar14 != pGVar8;
                pGVar14 = (Graph *)((long)&pGVar14->r + 1)) {
              if (dmat.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)pGVar10].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[(long)pGVar14] == 1) {
                local_100 = (Graph *)((long)pGVar14 * 0x28);
                lVar20 = 0;
                for (pGVar16 = (Graph *)0x0; pGVar8 = local_d8, pGVar12 != pGVar16;
                    pGVar16 = (Graph *)((long)&pGVar16->r + 1)) {
                  rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)
                                      ((long)&(((local_c0->
                                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                              super__Bvector_impl_data + lVar20),(size_type)pGVar14)
                  ;
                  pvVar6 = local_c0;
                  if ((((*rVar24._M_p & rVar24._M_mask) != 0) &&
                      (dmat.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pGVar10].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)pGVar16] == 0)) && (bVar23 = !bVar15, bVar15 = true, bVar23))
                  {
                    rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)
                                        ((long)&(((local_c0->
                                                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                                super__Bvector_impl_data + lVar20),
                                        (size_type)pGVar14);
                    *rVar24._M_p = *rVar24._M_p | rVar24._M_mask;
                    rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)
                                        ((long)&local_100->r +
                                        (long)(pvVar6->
                                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start),
                                        (size_type)pGVar16);
                    *rVar24._M_p = *rVar24._M_p | rVar24._M_mask;
                    bVar15 = true;
                  }
                  lVar20 = lVar20 + 0x28;
                }
              }
            }
            pGVar10 = (Graph *)((long)&local_c8->r + 1);
          }
          lVar13 = 0;
          lVar20 = 0;
          while( true ) {
            if ((long)pGVar8 * 0x28 - lVar20 == 0) {
              iVar11 = *local_b8;
              *local_b8 = iVar11 / 2;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::vector(local_e0,local_e8,(allocator_type *)&local_60);
              iVar7 = (int)local_d0 + 1;
              local_100 = (Graph *)CONCAT44(local_100._4_4_,iVar7);
              uVar19 = (iVar11 / 2) * iVar7;
              local_f8 = (Graph *)(ulong)uVar19;
              iVar11 = uVar19 + 1;
              lVar20 = (long)pGVar8 * 0x18;
              for (lVar13 = 0; lVar20 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
                std::vector<int,_std::allocator<int>_>::resize
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(((local_e0->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + lVar13),(long)iVar11);
              }
              iVar7 = 0;
              while( true ) {
                pvVar3 = (local_e0->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (iVar11 - (int)local_d0 <= iVar7) break;
                for (lVar13 = 0; lVar20 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
                  *(undefined4 *)
                   (*(long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data + lVar13) + (long)iVar7 * 4) =
                       0xfffffffc;
                }
                iVar7 = iVar7 + (int)local_100;
              }
              for (lVar13 = 0; lVar20 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
                *(undefined4 *)
                 (*(long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + lVar13) + (long)(int)local_f8 * 4) =
                     0xfffffffb;
              }
              for (iVar11 = 1; iVar11 <= (int)local_f8; iVar11 = iVar11 + (int)local_100) {
                for (pGVar10 = (Graph *)0x0; pGVar10 != pGVar8;
                    pGVar10 = (Graph *)((long)&pGVar10->r + 1)) {
                  pvVar3 = (local_e0->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  for (pGVar14 = (Graph *)0x0; pGVar12 != pGVar14;
                      pGVar14 = (Graph *)((long)&pGVar14->r + 1)) {
                    *(undefined4 *)
                     (*(long *)&pvVar3[(long)pGVar10].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + (long)iVar11 * 4 +
                     (long)pGVar14 * 4) =
                         *(undefined4 *)
                          (*(long *)(CONCAT44(treeAdjMat.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              treeAdjMat.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    (long)pGVar10 * 0x18) + (long)pGVar14 * 4);
                  }
                }
              }
              iVar11 = 1;
              local_e8 = 1;
              piVar22 = (int *)0x6;
              pGVar8 = (Graph *)0x0;
              while (pvVar5 = local_e0, pGVar8 != local_d8) {
                local_b0 = (Graph *)((long)&pGVar8->r + 1);
                sVar21 = local_e8;
                local_c8 = pGVar8;
                local_b8 = piVar22;
                while( true ) {
                  if ((int)local_d0 <= (int)sVar21) break;
                  rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((local_c0->
                                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + (long)pGVar8,
                                      sVar21);
                  if (((*rVar24._M_p & rVar24._M_mask) != 0) &&
                     (*(int *)(*(long *)(CONCAT44(treeAdjMat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  treeAdjMat.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        (long)pGVar8 * 0x18) + sVar21 * 4) == 0)) {
                    pvVar3 = (local_e0->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    *(undefined4 *)
                     (*(long *)&pvVar3[(long)pGVar8].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + (long)((int)sVar21 + iVar11) * 4)
                         = 1;
                    *(undefined4 *)
                     (*(long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data + (long)piVar22 * 4) +
                     (long)((int)local_c8 + iVar11) * 4) = 1;
                    iVar11 = iVar11 + (int)local_100;
                  }
                  sVar21 = sVar21 + 1;
                  piVar22 = (int *)((long)piVar22 + 6);
                }
                local_e8 = local_e8 + 1;
                piVar22 = (int *)((long)local_b8 + 6);
                pGVar8 = local_b0;
              }
              for (iVar11 = 1; iVar11 <= (int)local_f8; iVar11 = iVar11 + (int)local_100) {
                lVar20 = (long)iVar11;
                bVar15 = false;
                while (!bVar15) {
                  bVar15 = true;
                  for (pGVar8 = (Graph *)0x0; pGVar8 != local_d8;
                      pGVar8 = (Graph *)((long)&pGVar8->r + 1)) {
                    pvVar3 = (local_e0->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    pvVar17 = pvVar3 + (long)pGVar8;
                    iVar7 = 0;
                    pGVar10 = pGVar12;
                    lVar13 = lVar20;
                    while (bVar23 = pGVar10 != (Graph *)0x0,
                          pGVar10 = (Graph *)((long)&pGVar10[-1].treeAdjMat.
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 7), bVar23) {
                      iVar7 = iVar7 + (uint)(*(int *)(*(long *)&(pvVar17->
                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + lVar13 * 4) == 1
                                            );
                      lVar13 = lVar13 + 1;
                    }
                    if (iVar7 == 1) {
                      lVar13 = lVar20;
                      for (lVar18 = 0; (long)pGVar12 * 0x18 - lVar18 != 0; lVar18 = lVar18 + 0x18) {
                        lVar4 = *(long *)&(pvVar17->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data;
                        if (*(int *)(lVar4 + lVar13 * 4) == 1) {
                          *(undefined4 *)(lVar4 + lVar13 * 4) = 0;
                          *(undefined4 *)
                           ((long)pGVar8 * 4 +
                            *(long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data + lVar18) + lVar20 * 4
                           ) = 0;
                          bVar15 = false;
                        }
                        lVar13 = lVar13 + 1;
                      }
                    }
                  }
                }
              }
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector(&dmat);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector(&copytreeAdjMat);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector(&treeAdjMat);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&x.super__Vector_base<int,_std::allocator<int>_>);
              return pvVar5;
            }
            lVar18 = CONCAT44(treeAdjMat.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              treeAdjMat.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
            if (*(long *)(lVar18 + 8 + lVar13) - *(long *)(lVar18 + lVar13) >> 2 != local_e8) break;
            iVar11 = countDifference<std::vector<int,std::allocator<int>>,std::vector<bool,std::allocator<bool>>>
                               (local_b0,(vector<int,_std::allocator<int>_> *)(lVar18 + lVar13),
                                (vector<bool,_std::allocator<bool>_> *)
                                ((long)&(((local_c0->
                                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                        super__Bvector_impl_data + lVar20));
            *local_b8 = *local_b8 + iVar11;
            lVar20 = lVar20 + 0x28;
            lVar13 = lVar13 + 0x18;
          }
          __assert_fail("static_cast<size_t>(r)==treeAdjMat_i.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                        ,200,
                        "vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)");
        }
        pGVar14 = (Graph *)0x0;
        do {
          if (pGVar12 == pGVar14) goto LAB_00102e74;
          piVar1 = copytreeAdjMat.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pGVar8].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          piVar22 = piVar1 + (long)pGVar14;
          pGVar14 = (Graph *)((long)&pGVar14->r + 1);
        } while (*piVar22 != 1);
        for (pGVar14 = (Graph *)0x0; pGVar12 != pGVar14; pGVar14 = (Graph *)((long)&pGVar14->r + 1))
        {
          dmat.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar11].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(long)pGVar14] = piVar1[(long)pGVar14];
        }
        iVar11 = iVar11 + 1;
LAB_00102e74:
        pGVar8 = (Graph *)((long)&pGVar8->r + 1);
      } while( true );
    }
    pGVar14 = (Graph *)0x0;
    do {
      if (pGVar12 == pGVar14) goto LAB_00102de8;
      piVar22 = copytreeAdjMat.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pGVar8].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + (long)pGVar14;
      pGVar14 = (Graph *)((long)&pGVar14->r + 1);
    } while (*piVar22 != 1);
    uVar19 = uVar19 + 1;
LAB_00102de8:
    pGVar8 = (Graph *)((long)&pGVar8->r + 1);
  } while( true );
}

Assistant:

vector<vector<int>> Gotlieb(int r, int *m, vector<vector<bool>>& adjMatrix)
    {
        *m = 0; int i, j, k, c, nu, done, f, n;
        vector<int> x(r, 0);
        //Block 1
        vector<vector<int>> treeAdjMat(r, vector<int>(r));
        vector<vector<int>> copytreeAdjMat(r, vector<int>(r));
        for (i=0; i < r; i++)
        {
            done = 0;
            for (j=i; j < r; j++)
            {
                if(adjMatrix[i][j]==1 && done==0){
                    treeAdjMat[i][j]=1;
                    treeAdjMat[j][i]=1;
                    done=1;
                }
            }
        }
        //Block 2
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                assert(i < r);
                copytreeAdjMat[i][j]=treeAdjMat[i][j];
            }
        }
        cout << r << "\n";

        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(k=0; k<r; k++)
                        if(copytreeAdjMat[j][k]==1){
                            copytreeAdjMat[i][k]=copytreeAdjMat[j][k];
                            copytreeAdjMat[j][k]=-copytreeAdjMat[j][k];
                        }
                }
            }
        }

        // now join together the strands that are part of a single cord
        for(j=0; j<r; j++){
            bool found = false;
            for(i=0; i<r; i++)
            {
                if(copytreeAdjMat[i][j]==1 && !found)
                {
                    k=i;
                    found=true;
                }
                else if(copytreeAdjMat[i][j]==1 && found){
                    for(int n=0; n<r; n++)
                        if(copytreeAdjMat[i][n]==1)
                        {
                            copytreeAdjMat[k][n]=copytreeAdjMat[i][n];
                            copytreeAdjMat[i][n]=-copytreeAdjMat[i][n];
                        }
                }
            }
        }

        //count how many lines the matrix c has
        n=0;
        for(i=0;i<r; i++)
        {
            for(j=0;j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1){
                    n++;
                    break;
                }
            }
        }

        vector<vector<int>> dmat(n, vector<int>(r));

        k=0;
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(f=0; f<r; f++)
                    {
                        dmat[k][f]=copytreeAdjMat[i][f];
                    }
                    k++;
                    break;
                }

            }
        }

        //correctness check
        for(j=0; j<r; j++)
        {
            for(i=0; i<n; i++)
            {
                assert(i<n);
                if(dmat[i][j]==1)
                {
                    continue;
                }
                if(dmat[i][j]==0 && j==n-1)
                {
                    printf("\nError in block 2 while searching for independent meshes\n");
                }
            }
        }

        // So far, we have constructed a spanning tree. Now let focus on finding cycle bases
        /*BLOCK 3*/
        f=0;
        for(i=0;i<n; i++)
            for(j=0;j<r; j++)
                if(dmat[i][j]==1)
                    for(k=0; k<r; k++) /*I'm going to see if I find a side that joins the cords in the j-th column of a*/
                        if(adjMatrix[k][j]==1 && dmat[i][k]==0 && f==0) {
                            /*printf("k=%d\tj=%d\n", k, j);*/
                            adjMatrix[k][j]=1;
                            adjMatrix[j][k]=1;
                            f=1;       /*I have to add only one side!*/
                        }

        for(i=0; i<r; i++)
        {
            vector<int> &treeAdjMat_i = treeAdjMat[i];
            vector<bool> &adjMatrix_i = adjMatrix[i];

            //int n_differences = 0;
            assert(static_cast<size_t>(r)==treeAdjMat_i.size());
            *m += countDifference(treeAdjMat_i,adjMatrix_i);
        }
        int &count = *m;
        count /= 2;
        //count how many sides have to be eliminated to obtain the tree graph = number of independent links
        c = r*count + count + 1;
        vector<vector<int>> indm(r);
        for (int i = 0; i<r; ++i)
        {
            indm[i].resize(c);
        }

        for (j = 0; j < c-r; j = j+r+1)
            for (i = 0; i < r; i++)
                indm[i][j] = -4;
        for (i = 0; i < r; i++)
            indm[i][c-1]=-5;
        for (k = 1; k < c; k=k+r+1)
            for(i = 0; i < r; i++)
                for(j = 0; j < r; j++)
                    indm[i][j+k] = treeAdjMat[i][j];
        // add the sides at a time
        k = 1;
        for(i = 0; i < r; i++)
            for(j = i+1; j<r; j++)
                if(adjMatrix[i][j]==1 && treeAdjMat[i][j]==0)
                {
                    indm[i][j+k]=1;
                    indm[j][i+k]=1;
                    k = k + r + 1;
                }
        /*I remove the segments that are outside the loop (see drawing)*/
        nu = 0; /*nu is the number one on a line*/
        done=0;
        for(k=1; k<c; k=k+r+1){
            while(done==0){
                done=1;
                for(i=0; i<r; i++){
                    for(j=0; j<r; j++)
                    {
                        /*Count how many ones are on a line*/
                        if(indm[i][j+k]==1)
                        {
                            nu++;
                        }
                    }
                    if(nu==1)
                    {
                        /*if there is only one,  make it null*/
                        for(j=0; j<r; j++)    /*I am in the j of 1*/
                        {
                            if(indm[i][j+k]==1){
                                indm[i][j+k]=0;
                                indm[j][i+k]=0;
                                done=0;
                            }
                        }
                    }
                    nu=0;
                }
            }
            done=0;
        }
        return indm;
    }